

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.hpp
# Opt level: O1

void Keyset::cryptBlocksInternal<unsigned_int*,unsigned_int*,false,void>
               (uint *srcFirst,uint *srcLast,uint *dstFirst)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uint uVar4;
  int iVar5;
  
  if (srcFirst != srcLast) {
    uVar2 = *srcFirst;
    puVar3 = srcFirst + 1;
    *dstFirst = uVar2;
    if (puVar3 != srcLast) {
      uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      do {
        uVar1 = *puVar3;
        uVar4 = 0;
        iVar5 = 4;
        do {
          uVar4 = uVar4 << 8 ^ g_crc32_0x04C11DB7._M_elems[(uVar2 ^ uVar4) >> 0x18];
          uVar2 = uVar2 << 8;
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
        uVar2 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
        uVar1 = swap_bytes(~(uVar4 ^ uVar2));
        dstFirst[1] = uVar1;
        dstFirst = dstFirst + 1;
        puVar3 = puVar3 + 1;
      } while (puVar3 != srcLast);
    }
  }
  return;
}

Assistant:

static void cryptBlocksInternal(InputIt srcFirst, InputIt srcLast, OutputIt dstFirst)
	{
		if (srcFirst == srcLast) {
			return;
		}

		typedef typename std::iterator_traits<InputIt>::value_type ValueType;
		using boost::endian::endian_reverse;

		ValueType prevBlock = endian_reverse(*srcFirst++);
		*dstFirst++ = (NeedSwapEndian ? prevBlock : endian_reverse(prevBlock));

		if (srcFirst == srcLast) {
			return;
		}

		std::transform(
			srcFirst, srcLast, dstFirst,
			[&prevBlock](const ValueType in) {
				const ValueType curBlock = endian_reverse(in);
				ValueType out = cryptBlock(curBlock, prevBlock);
				if (!NeedSwapEndian) {
					out = endian_reverse(out);
				}
				prevBlock = curBlock;
				return out;
			}
		);
	}